

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns)

{
  xmlNsPtr pxVar1;
  int iVar2;
  int iVar3;
  xmlChar *str1;
  long lVar4;
  xmlChar *str2;
  long lVar5;
  xmlNsPtr *ppxVar6;
  xmlChar *pxVar7;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam((xmlC14NCtxPtr)0x0);
    return 0;
  }
  if (ns == (xmlNsPtr)0x0) {
    pxVar7 = "";
    str1 = "";
  }
  else {
    pxVar7 = ns->prefix;
    if (pxVar7 == (xmlChar *)0x0) {
      pxVar7 = "";
    }
    str1 = ns->href;
    if (str1 == (xmlChar *)0x0) {
      str1 = "";
    }
  }
  iVar2 = xmlC14NStrEqual(pxVar7,(xmlChar *)0x0);
  if (iVar2 == 0) {
    ppxVar6 = cur->nsTab;
    if (ppxVar6 == (xmlNsPtr *)0x0) {
      return 0;
    }
  }
  else {
    iVar2 = xmlC14NStrEqual(str1,(xmlChar *)0x0);
    ppxVar6 = cur->nsTab;
    if (ppxVar6 == (xmlNsPtr *)0x0) {
      return iVar2;
    }
    if (iVar2 != 0) {
      iVar2 = 1;
      lVar4 = 0;
      goto LAB_0015d804;
    }
  }
  lVar4 = (long)cur->nsPrevStart;
  iVar2 = 0;
LAB_0015d804:
  lVar5 = (long)cur->nsCurEnd;
  do {
    if (lVar5 <= lVar4) {
      return iVar2;
    }
    pxVar1 = ppxVar6[lVar5 + -1];
    if (pxVar1 == (xmlNsPtr)0x0) {
      str2 = (xmlChar *)0x0;
    }
    else {
      str2 = pxVar1->prefix;
    }
    iVar3 = xmlC14NStrEqual(pxVar7,str2);
    lVar5 = lVar5 + -1;
  } while (iVar3 == 0);
  if (pxVar1 == (xmlNsPtr)0x0) {
    pxVar7 = (xmlChar *)0x0;
  }
  else {
    pxVar7 = pxVar1->href;
  }
  iVar2 = xmlC14NStrEqual(str1,pxVar7);
  return iVar2;
}

Assistant:

static int
xmlC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns)
{
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam(NULL);
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = (has_empty_ns) ? 0 : cur->nsPrevStart;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		return(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL));
	    }
        }
    }
    return(has_empty_ns);
}